

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O3

void __thiscall
RK_Individual::geraPesosConfInicial(RK_Individual *this,int *idsAbertos,int n,Graph *g)

{
  int iVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  Vertex *pVVar4;
  int iVar5;
  long lVar6;
  Edge *pEVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  long lVar11;
  
  auVar3 = _DAT_0010b4f0;
  iVar5 = this->number_of_edges;
  if (0 < (long)iVar5) {
    pdVar2 = this->weights;
    lVar6 = (long)iVar5 + -1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar9 = auVar9 ^ _DAT_0010b4f0;
    auVar10 = _DAT_0010b4e0;
    do {
      auVar12 = auVar10 ^ auVar3;
      if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                  auVar9._4_4_ < auVar12._4_4_) & 1)) {
        *(undefined8 *)((long)pdVar2 + lVar6) = 0x3ff0000000000000;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        *(undefined8 *)((long)pdVar2 + lVar6 + 8) = 0x3ff0000000000000;
      }
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
      lVar6 = lVar6 + 0x10;
    } while ((ulong)(iVar5 + 1U >> 1) << 4 != lVar6);
  }
  pVVar4 = g->verticesList;
  if (pVVar4 != (Vertex *)0x0) {
    iVar5 = 0;
    do {
      for (pEVar7 = pVVar4->edgesList; pEVar7 != (Edge *)0x0; pEVar7 = pEVar7->nextEdge) {
        if ((pEVar7->modifiable == true) && (pEVar7->marked == true)) {
          if (0 < n) {
            iVar1 = pEVar7->id;
            pdVar2 = this->weights;
            uVar8 = 0;
            do {
              if (iVar1 == idsAbertos[uVar8]) {
                pdVar2[iVar5] = 0.0;
              }
              uVar8 = uVar8 + 1;
            } while ((uint)n != uVar8);
          }
          iVar5 = iVar5 + 1;
        }
      }
      pVVar4 = pVVar4->nextVertex;
    } while (pVVar4 != (Vertex *)0x0);
  }
  return;
}

Assistant:

void RK_Individual::geraPesosConfInicial(int *idsAbertos, int n, Graph *g){

//    cout << "vai gerar conf inicial:\n--------------------------------" << endl;

//    cout << "idsAberto = {" << endl;
//    for(int i=0; i<n; i++)
//        cout << idsAbertos[i] << endl;
//    cout << "}" << endl;

    this->resetaPesos(1.0);
    int j=0;
    for(Vertex *no = g->get_verticesList(); no != NULL; no= no->getNext()){

        for(Edge *a = no->getEdgesList(); a != NULL; a= a->getNext()){

            if(a->getModifiable() == true && a->getMarked() == true){
                for(int i=0; i<n; i++){
                    if(a->getID()==idsAbertos[i]){
                        this->weights[j] = 0.0;
//                            cout << "A{" <<a->getID() << "}" << endl;
                    }
                }
                j++;
            }

        }
    }
//    cout << "--------------------------------" << endl;
}